

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O3

void __thiscall
CVmObjStringBuffer::add_undo_rec
          (CVmObjStringBuffer *this,vm_obj_id_t self,strbuf_undo_action action,int32_t idx,
          int32_t old_len,int32_t new_len)

{
  int iVar1;
  strbuf_undo_action *key;
  strbuf_undo_action sVar2;
  strbuf_undo_action sVar3;
  vm_val_t nilval;
  vm_val_t local_40;
  
  if (new_len != 0 || old_len != 0) {
    sVar2 = STRBUF_UNDO_INS;
    if (action != STRBUF_UNDO_REPL || old_len != 0) {
      sVar2 = action;
    }
    sVar3 = STRBUF_UNDO_DEL;
    if (sVar2 != STRBUF_UNDO_REPL || new_len != 0) {
      sVar3 = sVar2;
    }
    iVar1 = 0x14;
    if (sVar3 - STRBUF_UNDO_DEL < 2) {
      iVar1 = old_len * 4 + 0x10;
    }
    key = (strbuf_undo_action *)malloc((long)iVar1);
    *key = sVar3;
    key[1] = idx;
    key[2] = old_len;
    key[3] = new_len;
    if (sVar3 - STRBUF_UNDO_DEL < 2) {
      memcpy(key + 4,(this->super_CVmObject).ext_ + (long)idx * 4 + 0xc,(long)old_len << 2);
    }
    local_40.typ = VM_NIL;
    iVar1 = CVmUndo::add_new_record_ptr_key(G_undo_X,self,key,&local_40);
    if (iVar1 == 0) {
      free(key);
    }
  }
  return;
}

Assistant:

void CVmObjStringBuffer::add_undo_rec(
    VMG_ vm_obj_id_t self, strbuf_undo_action action,
    int32_t idx, int32_t old_len, int32_t new_len)
{
    /* 
     *   if we're not inserting or deleting anything, there's no change, so
     *   there's no undo information to save 
     */
    if (old_len == 0 && new_len == 0)
        return;

    /* 
     *   replacing zero bytes is simply an insertion; substituting zero bytes
     *   is a deletion 
     */
    if (action == STRBUF_UNDO_REPL && old_len == 0)
        action = STRBUF_UNDO_INS;
    if (action == STRBUF_UNDO_REPL && new_len == 0)
        action = STRBUF_UNDO_DEL;

    /* 
     *   Figure the size for the extension record.  For an insertion, we
     *   don't need any extra data, since we're replacing zero characters.
     *   For a deletion or replacement, we need to make a copy of the
     *   characters we're removing, so we need old_len extra wchar_t's.  
     */
    int32_t siz = sizeof(strbuf_undo_rec);
    if (action == STRBUF_UNDO_DEL || action == STRBUF_UNDO_REPL)
        siz += (old_len - 1) * sizeof(wchar_t);

    /* allocate our record extension */
    strbuf_undo_rec *rec = (strbuf_undo_rec *)t3malloc(siz);

    /* set up the record */
    rec->action = action;
    rec->idx = idx;
    rec->old_len = old_len;
    rec->new_len = new_len;

    /* if we're deleting or replacing text, save the old text */
    if (action == STRBUF_UNDO_DEL || action == STRBUF_UNDO_REPL)
        memcpy(rec->str, get_ext()->buf + idx, old_len * sizeof(rec->str[0]));
    
    /* 
     *   Add the record to the global undo stream.  (We don't have anything
     *   to store in the 'value' field, so just store nil.) 
     */
    vm_val_t nilval;
    nilval.set_nil();
    if (!G_undo->add_new_record_ptr_key(vmg_ self, rec, &nilval))
    {
        /* 
         *   we didn't add an undo record, so our extra undo information
         *   isn't actually going to be stored in the undo system - hence we
         *   must delete our extra information 
         */
        t3free(rec);
    }
}